

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer ppVar1;
  pointer puVar2;
  bool bVar3;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *nbrs;
  time_t tVar4;
  ostream *poVar5;
  ulong uVar6;
  pointer pvVar7;
  undefined8 extraout_RAX;
  pointer *pppVar8;
  iterator __begin2;
  pointer ppVar9;
  string *psVar10;
  long lVar11;
  char *pcVar12;
  string *psVar13;
  string *psVar14;
  unsigned_long uVar15;
  pointer ppVar16;
  long lVar17;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __i;
  pointer puVar18;
  long lVar19;
  float fVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double epsilon;
  double epsilon_00;
  double epsilon_01;
  double epsilon_02;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  int iVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar31;
  allocator local_919;
  Graph graph;
  double local_900;
  double local_8f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vec_degree;
  vector<double,_std::allocator<double>_> budget_list;
  Graph resgraph;
  Timer mainTimer;
  string infilename;
  TArgument Arg;
  vector<unsigned_long,_std::allocator<unsigned_long>_> res;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  TAlg tAlg;
  ofstream outputFile;
  
  tVar4 = time((time_t *)0x0);
  dsfmt_chk_init_gen_rand(&dsfmt_global_data,(uint32_t)tVar4,0x4de1);
  Argument::Argument(&Arg,argc,argv);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outputFile,
                 &Arg._dir,"/");
  psVar14 = &Arg._graphname;
  std::operator+(&infilename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outputFile,
                 psVar14);
  std::__cxx11::string::~string((string *)&outputFile);
  if ((Arg._func & 0xfffffffdU) == 0) {
    std::__cxx11::string::string((string *)&local_520,(string *)&infilename);
    std::__cxx11::string::string((string *)&local_540,(string *)&Arg._mode);
    GraphBase::format_graph(&local_520,&local_540);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::string::~string((string *)&local_520);
    if (Arg._func == 0) {
      iVar30 = 1;
      goto LAB_0010fbab;
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"---The Begin of ");
  poVar5 = std::operator<<(poVar5,(string *)&Arg._outFileName);
  std::operator<<(poVar5,"---\n");
  mainTimer.__StartTime.__d.__r = (duration)0;
  mainTimer.__LastTime.__d.__r = (duration)0;
  mainTimer.__EndTime.__d.__r = (duration)0;
  mainTimer.__StartTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  mainTimer.__processName = "main";
  mainTimer.__LastTime.__d.__r = mainTimer.__StartTime.__d.__r;
  mainTimer.__EndTime.__d.__r = mainTimer.__StartTime.__d.__r;
  poVar5 = std::operator<<((ostream *)&std::cout,"Format Graph Successfully");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::string((string *)&local_560,(string *)&infilename);
  std::__cxx11::string::string((string *)&local_580,(string *)&Arg._probDist);
  GraphBase::load_graph(&graph,&local_560,false,&local_580,Arg._probEdge);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::string((string *)&local_5a0,(string *)&infilename);
  std::__cxx11::string::string((string *)&local_5c0,(string *)&Arg._probDist);
  GraphBase::load_graph(&resgraph,&local_5a0,true,&local_5c0,Arg._probEdge);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5a0);
  poVar5 = std::operator<<((ostream *)&std::cout,"Load Graph Successfully");
  std::endl<char,std::char_traits<char>>(poVar5);
  _outputFile = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&vec_degree,
             ((long)graph.
                    super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)graph.
                   super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18,
             (value_type_conflict2 *)&outputFile,(allocator_type *)&tAlg);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tAlg,
                 "degree_",psVar14);
  std::ofstream::ofstream(&outputFile,(string *)&tAlg,_S_out);
  std::__cxx11::string::~string((string *)&tAlg);
  pppVar8 = &((graph.
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  lVar19 = 0;
  for (lVar11 = 0;
      ((long)graph.
             super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
      (long)graph.
            super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) / 0x18 != lVar11; lVar11 = lVar11 + 1) {
    uVar15 = (long)*pppVar8 - (long)((_Vector_impl_data *)(pppVar8 + -1))->_M_start >> 3;
    vec_degree.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[lVar11] = uVar15;
    lVar19 = lVar19 + uVar15;
    pppVar8 = pppVar8 + 3;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"# Node: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"# Edge: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<((ostream *)&std::cout,"Ave degree: ");
  auVar24._8_4_ = (int)((ulong)lVar19 >> 0x20);
  auVar24._0_8_ = lVar19;
  auVar24._12_4_ = 0x45300000;
  lVar11 = ((long)graph.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)graph.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  auVar25._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar25._0_8_ = lVar11;
  auVar25._12_4_ = 0x45300000;
  poVar5 = std::ostream::_M_insert<double>
                     (((auVar24._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0)) /
                      ((auVar25._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)));
  std::endl<char,std::char_traits<char>>(poVar5);
  std::ofstream::close();
  puVar2 = vec_degree.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (vec_degree.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      vec_degree.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar19 = (long)vec_degree.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)vec_degree.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar6 = lVar19 >> 3;
    lVar11 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
              (vec_degree.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               vec_degree.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar19 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                (puVar2,vec_degree.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    else {
      puVar18 = puVar2 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                (puVar2,puVar18);
      for (; puVar18 !=
             vec_degree.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish; puVar18 = puVar18 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Val_comp_iter<main::__0>>
                  (puVar18);
      }
    }
  }
  tAlg.__numV = 0;
  tAlg._4_4_ = 0;
  std::vector<double,_std::allocator<double>_>::vector
            (&budget_list,
             ((long)graph.
                    super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)graph.
                   super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18,(value_type_conflict4 *)&tAlg,
             (allocator_type *)&res);
  lVar11 = ((long)graph.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)graph.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  auVar26._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar26._0_8_ = lVar11;
  auVar26._12_4_ = 0x45300000;
  dVar21 = (auVar26._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
  pppVar8 = &((graph.
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  dVar27 = 0.01;
  for (lVar19 = 0; lVar11 != lVar19; lVar19 = lVar19 + 1) {
    lVar17 = (long)*pppVar8 - (long)((_Vector_impl_data *)(pppVar8 + -1))->_M_start;
    uVar6 = lVar17 >> 3;
    iVar30 = (int)(lVar17 >> 0x23);
    if (vec_degree.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[(int)(Arg._percent * dVar21)] < uVar6) {
      auVar28._8_4_ = iVar30;
      auVar28._0_8_ = uVar6;
      auVar28._12_4_ = 0x45300000;
      dVar31 = ((auVar28._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) * 0.01;
    }
    else {
      auVar29._8_4_ = iVar30;
      auVar29._0_8_ = uVar6;
      auVar29._12_4_ = 0x45300000;
      dVar31 = ((auVar29._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) *
               Arg._normalpha * 10.0;
    }
    budget_list.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar19] = dVar31;
    pppVar8 = pppVar8 + 3;
  }
  dVar21 = (double)(int)(dVar21 * Arg._percent) * Arg._budpercent;
  poVar5 = std::operator<<((ostream *)&std::cout,"0.3 percent degree: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"0.5 percent degree: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"0.7 percent degree: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"0.9 percent degree: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"0.95 percent degree: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"0.99 percent degree: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"0.999 percent degree: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"0.9999 percent degree: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"0.99995 percent degree: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"0.99999 percent degree: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"0.999999 percent degree: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"0.9999999 percent degree: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"0.99999999 percent degree: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"# nodes: ");
  lVar11 = ((long)graph.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)graph.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  auVar22._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar22._0_8_ = lVar11;
  auVar22._12_4_ = 0x45300000;
  poVar5 = (ostream *)
           std::ostream::operator<<
                     (poVar5,(int)(((auVar22._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0))
                                  * Arg._percent));
  std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<((ostream *)&std::cout,"real budget: ");
  poVar5 = std::ostream::_M_insert<double>(dVar21);
  std::endl<char,std::char_traits<char>>(poVar5);
  psVar13 = &Arg._algName;
  bVar3 = std::operator==(psVar13,"CELF");
  if ((((bVar3) || (bVar3 = std::operator==(psVar13,"celf"), bVar3)) ||
      (bVar3 = std::operator==(psVar13,"CELF++"), bVar3)) ||
     (bVar3 = std::operator==(psVar13,"celf++"), bVar3)) {
    bVar3 = std::operator==(psVar13,"CELF");
    if ((bVar3) || (bVar3 = std::operator==(psVar13,"celf"), bVar3)) {
      poVar5 = std::operator<<((ostream *)&std::cout,"start CELF algorithm");
      std::endl<char,std::char_traits<char>>(poVar5);
      tAlg._0_8_ = std::chrono::_V2::system_clock::now();
      tAlg._24_8_ = anon_var_dwarf_2cc76;
      tAlg.__numE = tAlg._0_8_;
      tAlg.__numRRsets = tAlg._0_8_;
      CELF::celfalgo(&res,&graph,Arg._budget,&budget_list,Arg._model);
      std::operator<<((ostream *)&std::cout,"Time used (sec): ");
      dVar27 = Timer::get_total_time((Timer *)&tAlg);
      poVar5 = std::ostream::_M_insert<double>(dVar27);
      std::endl<char,std::char_traits<char>>(poVar5);
      puVar2 = res.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar18 = res.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar18 != puVar2; puVar18 = puVar18 + 1) {
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::operator<<(poVar5," ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar5 = std::operator<<((ostream *)&std::cout,"Seed Size: ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      bVar3 = std::operator==(psVar13,"CELF++");
      if ((!bVar3) && (bVar3 = std::operator==(psVar13,"celf++"), !bVar3)) goto LAB_0010fb71;
      poVar5 = std::operator<<((ostream *)&std::cout,"start CELF++ algorithm");
      std::endl<char,std::char_traits<char>>(poVar5);
      tAlg._0_8_ = std::chrono::_V2::system_clock::now();
      tAlg._24_8_ = anon_var_dwarf_2cc76;
      tAlg.__numE = tAlg._0_8_;
      tAlg.__numRRsets = tAlg._0_8_;
      CELFPP::celfppalgo(&res,&graph,Arg._budget,&budget_list,Arg._model);
      std::operator<<((ostream *)&std::cout,"Time used (sec): ");
      dVar27 = Timer::get_total_time((Timer *)&tAlg);
      poVar5 = std::ostream::_M_insert<double>(dVar27);
      std::endl<char,std::char_traits<char>>(poVar5);
      puVar2 = res.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar18 = res.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar18 != puVar2; puVar18 = puVar18 + 1) {
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::operator<<(poVar5," ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar5 = std::operator<<((ostream *)&std::cout,"Seed Size: ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&res.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  else {
    bVar3 = std::operator==(psVar13,"opim-c");
    if (((((((bVar3) || (bVar3 = std::operator==(psVar13,"OPIM-C"), bVar3)) ||
           (bVar3 = std::operator==(psVar13,"opim"), bVar3)) ||
          ((bVar3 = std::operator==(psVar13,"OPIM"), bVar3 ||
           (bVar3 = std::operator==(psVar13,"opim-b"), bVar3)))) ||
         ((bVar3 = std::operator==(psVar13,"OPIM-B"), bVar3 ||
          ((bVar3 = std::operator==(psVar13,"opim-b-n"), bVar3 ||
           (bVar3 = std::operator==(psVar13,"OPIM-B-N"), bVar3)))))) ||
        ((bVar3 = std::operator==(psVar13,"opim-b-fe"), bVar3 ||
         ((((bVar3 = std::operator==(psVar13,"OPIM-B-FE"), bVar3 ||
            (bVar3 = std::operator==(psVar13,"opim-ba"), bVar3)) ||
           (bVar3 = std::operator==(psVar13,"OPIM-BA"), bVar3)) ||
          (((bVar3 = std::operator==(psVar13,"opim-b-fa"), bVar3 ||
            (bVar3 = std::operator==(psVar13,"OPIM-B-FA"), bVar3)) ||
           ((bVar3 = std::operator==(psVar13,"opim-a"), bVar3 ||
            ((bVar3 = std::operator==(psVar13,"OPIM-A"), bVar3 ||
             (bVar3 = std::operator==(psVar13,"opim-a-f"), bVar3)))))))))))) ||
       (bVar3 = std::operator==(psVar13,"OPIM-A-F"), bVar3)) {
      pvVar7 = resgraph.
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (Arg._model == LT) {
        for (; pvVar7 != resgraph.
                         super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish; pvVar7 = pvVar7 + 1) {
          ppVar1 = (pvVar7->
                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          fVar20 = 0.0;
          ppVar9 = (pvVar7->
                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          for (ppVar16 = ppVar9; ppVar16 != ppVar1; ppVar16 = ppVar16 + 1) {
            fVar20 = fVar20 + ppVar16->second;
            ppVar16->second = fVar20;
          }
          for (; ppVar9 != ppVar1; ppVar9 = ppVar9 + 1) {
            ppVar9->second = ppVar9->second / fVar20;
          }
        }
      }
      res.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xbff0000000000000;
      res.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0xbff0000000000000;
      res.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0xbff0000000000000;
      Alg::Alg(&tAlg,&resgraph,(TResult *)&res);
      tAlg.__hyperG._cascadeModel = Arg._model;
      tAlg.__hyperGVldt._cascadeModel = Arg._model;
      std::operator<<((ostream *)&std::cout,"  ==>Graph loaded for RIS! total time used (sec): ");
      dVar31 = Timer::get_total_time(&mainTimer);
      poVar5 = std::ostream::_M_insert<double>(dVar31);
      std::operator<<(poVar5,'\n');
      psVar10 = &Arg._mode;
      bVar3 = std::operator==(psVar10,"0");
      iVar30 = 0;
      if ((!bVar3) && (bVar3 = std::operator==(psVar10,"vanilla"), !bVar3)) {
        bVar3 = std::operator==(psVar10,"1");
        if ((bVar3) || (bVar3 = std::operator==(psVar10,"last"), bVar3)) {
          iVar30 = 1;
        }
        else {
          iVar30 = 2;
        }
      }
      local_900 = Arg._delta;
      if (Arg._delta < 0.0) {
        lVar11 = ((long)resgraph.
                        super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)resgraph.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18;
        auVar23._8_4_ = (int)((ulong)lVar11 >> 0x20);
        auVar23._0_8_ = lVar11;
        auVar23._12_4_ = 0x45300000;
        local_900 = 1.0 / ((auVar23._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0));
      }
      bVar3 = std::operator==(psVar13,"opim-c");
      if ((bVar3) || (bVar3 = std::operator==(psVar13,"OPIM-C"), bVar3)) {
        Alg::opimc(&tAlg,Arg._seedsize,Arg._eps,local_900,iVar30);
      }
      else {
        bVar3 = std::operator==(psVar13,"opim");
        if ((bVar3) || (bVar3 = std::operator==(psVar13,"OPIM"), bVar3)) {
          Alg::opim(&tAlg,Arg._seedsize,Arg._samplesize,local_900,iVar30);
        }
        else {
          bVar3 = std::operator==(psVar13,"opim-b");
          if ((bVar3) || (bVar3 = std::operator==(psVar13,"OPIM-B"), bVar3)) {
            pcVar12 = "OPIM-B";
            poVar5 = std::operator<<((ostream *)&std::cout,"OPIM-B");
            std::endl<char,std::char_traits<char>>(poVar5);
            Alg::opimb(&tAlg,(Graph *)pcVar12,dVar21,&budget_list,Arg._eps,local_900,iVar30);
          }
          else {
            bVar3 = std::operator==(psVar13,"opim-b-n");
            if ((bVar3) || (bVar3 = std::operator==(psVar13,"OPIM-B-N"), bVar3)) {
              pcVar12 = "OPIM-B-NAIVE";
              poVar5 = std::operator<<((ostream *)&std::cout,"OPIM-B-NAIVE");
              std::endl<char,std::char_traits<char>>(poVar5);
              Alg::opimb_naive(&tAlg,(Graph *)pcVar12,dVar21,&budget_list,Arg._eps,local_900,0);
            }
            else {
              bVar3 = std::operator==(psVar13,"opim-b-fe");
              if ((bVar3) || (bVar3 = std::operator==(psVar13,"OPIM-B-FE"), bVar3)) {
                poVar5 = std::operator<<((ostream *)&std::cout,"OPIM-B-FAST-END");
                std::endl<char,std::char_traits<char>>(poVar5);
                if (Arg._model == LT) {
                  bVar3 = std::operator==(psVar14,"twitter");
                  if (bVar3) {
                    std::__cxx11::string::string((string *)&local_5e0,"LT",&local_919);
                    std::__cxx11::string::string((string *)&local_600,(string *)psVar14);
                    Alg::opimb_fast_end(&tAlg,(Graph *)psVar14,dVar21,&budget_list,Arg._eps,
                                        Arg._feps,local_900,&local_5e0,&local_600,1);
                    std::__cxx11::string::~string((string *)&local_600);
                    psVar14 = &local_5e0;
                  }
                  else {
                    if (Arg._model != LT) goto LAB_001105ec;
                    std::__cxx11::string::string((string *)&local_620,"LT",&local_919);
                    std::__cxx11::string::string((string *)&local_640,(string *)psVar14);
                    Alg::opimb_fast_end(&tAlg,(Graph *)psVar14,dVar21,&budget_list,Arg._eps,
                                        Arg._feps,local_900,&local_620,&local_640,iVar30);
                    std::__cxx11::string::~string((string *)&local_640);
                    psVar14 = &local_620;
                  }
                }
                else {
LAB_001105ec:
                  std::__cxx11::string::string((string *)&local_660,"IC",&local_919);
                  std::__cxx11::string::string((string *)&local_680,(string *)psVar14);
                  Alg::opimb_fast_end(&tAlg,(Graph *)psVar14,dVar21,&budget_list,Arg._eps,Arg._feps,
                                      local_900,&local_660,&local_680,iVar30);
                  std::__cxx11::string::~string((string *)&local_680);
                  psVar14 = &local_660;
                }
                std::__cxx11::string::~string((string *)psVar14);
              }
              else {
                bVar3 = std::operator==(psVar13,"opim-ba");
                if ((bVar3) || (bVar3 = std::operator==(psVar13,"OPIM-BA"), bVar3)) {
                  pcVar12 = "OPIM-B-APPROX";
                  poVar5 = std::operator<<((ostream *)&std::cout,"OPIM-B-APPROX");
                  std::endl<char,std::char_traits<char>>(poVar5);
                  Alg::opimb_approx(&tAlg,(Graph *)pcVar12,dVar21,&budget_list,Arg._eps,local_900,
                                    iVar30);
                }
                else {
                  bVar3 = std::operator==(psVar13,"opim-b-fa");
                  if ((!bVar3) && (bVar3 = std::operator==(psVar13,"OPIM-B-FA"), !bVar3)) {
                    bVar3 = std::operator==(psVar13,"opim-a");
                    if ((bVar3) || (bVar3 = std::operator==(psVar13,"OPIM-A"), bVar3)) {
LAB_001107fb:
                      poVar5 = std::operator<<((ostream *)&std::cout,"OPIM-APPROX");
                      std::endl<char,std::char_traits<char>>(poVar5);
                      local_8f8 = Arg._feps;
                      if (Arg._model != LT) goto LAB_001108ed;
                      std::__cxx11::string::string((string *)&local_420,"LT",&local_919);
                      psVar13 = psVar14;
                      std::__cxx11::string::string((string *)&local_440,(string *)psVar14);
                      Alg::opim_approx(&tAlg,(Graph *)psVar13,dVar21,&budget_list,epsilon_00,
                                       Arg._feps,local_900,&local_420,&local_440,iVar30);
                      dVar27 = Arg._feps;
                    }
                    else {
                      bVar3 = std::operator==(psVar13,"opim-a-f");
                      if ((!bVar3) && (bVar3 = std::operator==(psVar13,"OPIM-A-F"), !bVar3))
                      goto LAB_001100cf;
                      poVar5 = std::operator<<((ostream *)&std::cout,"OPIM-APPROX-FAST");
                      std::endl<char,std::char_traits<char>>(poVar5);
                      if (Arg._model == LT) {
                        std::__cxx11::string::string((string *)&local_4a0,"LT",&local_919);
                        psVar13 = psVar14;
                        std::__cxx11::string::string((string *)&local_4c0,(string *)psVar14);
                        Alg::opim_approx_fast
                                  (&tAlg,(Graph *)psVar13,dVar21,&budget_list,epsilon,dVar27,
                                   local_900,&local_4a0,&local_4c0,iVar30);
                        goto LAB_001107fb;
                      }
                    }
                    std::__cxx11::string::string((string *)&local_4e0,"IC",&local_919);
                    psVar13 = psVar14;
                    std::__cxx11::string::string((string *)&local_500,(string *)psVar14);
                    Alg::opim_approx_fast
                              (&tAlg,(Graph *)psVar13,dVar21,&budget_list,epsilon_01,dVar27,
                               local_900,&local_4e0,&local_500,iVar30);
LAB_001108ed:
                    std::__cxx11::string::string((string *)&local_460,"IC",&local_919);
                    std::__cxx11::string::string((string *)&local_480,(string *)psVar14);
                    Alg::opim_approx(&tAlg,(Graph *)psVar14,dVar21,&budget_list,epsilon_02,local_8f8
                                     ,local_900,&local_460,&local_480,iVar30);
                    std::__cxx11::string::~string((string *)&local_480);
                    std::__cxx11::string::~string((string *)&local_460);
                    Alg::~Alg(&tAlg);
                    ResultInfo::~ResultInfo((ResultInfo *)&res);
                    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                              (&budget_list.super__Vector_base<double,_std::allocator<double>_>);
                    std::ofstream::~ofstream(&outputFile);
                    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                              (&vec_degree.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
                    std::
                    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    ::~vector(&resgraph);
                    std::
                    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    ::~vector(&graph);
                    std::__cxx11::string::~string((string *)&infilename);
                    Argument::~Argument(&Arg);
                    _Unwind_Resume(extraout_RAX);
                  }
                  pcVar12 = "OPIM-B-FAST-APPROX";
                  poVar5 = std::operator<<((ostream *)&std::cout,"OPIM-B-FAST-APPROX");
                  std::endl<char,std::char_traits<char>>(poVar5);
                  Alg::opimb_fast_approx
                            (&tAlg,(Graph *)pcVar12,dVar21,&budget_list,Arg._eps,Arg._feps,local_900
                             ,iVar30);
                }
              }
            }
          }
        }
      }
LAB_001100cf:
      psVar10 = &Arg._outFileName;
      psVar14 = &Arg._resultFolder;
      IOcontroller::write_result(psVar10,(TResult *)&res,psVar14);
      IOcontroller::write_order_seeds(psVar10,(TResult *)&res,psVar14,&graph);
      bVar3 = std::operator==(psVar13,"opim-b");
      if ((((bVar3) || (bVar3 = std::operator==(psVar13,"OPIM-B"), bVar3)) ||
          (bVar3 = std::operator==(psVar13,"opim-b-n"), bVar3)) ||
         (((((bVar3 = std::operator==(psVar13,"OPIM-B-N"), bVar3 ||
             (bVar3 = std::operator==(psVar13,"opim-b-fe"), bVar3)) ||
            ((bVar3 = std::operator==(psVar13,"OPIM-B-FE"), bVar3 ||
             ((bVar3 = std::operator==(psVar13,"opim-ba"), bVar3 ||
              (bVar3 = std::operator==(psVar13,"OPIM-BA"), bVar3)))))) ||
           (bVar3 = std::operator==(psVar13,"opim-b-fa"), bVar3)) ||
          ((((bVar3 = std::operator==(psVar13,"OPIM-B-FA"), bVar3 ||
             (bVar3 = std::operator==(psVar13,"opim-a"), bVar3)) ||
            (bVar3 = std::operator==(psVar13,"OPIM-A"), bVar3)) ||
           ((bVar3 = std::operator==(psVar13,"opim-a-f"), bVar3 ||
            (bVar3 = std::operator==(psVar13,"OPIM-A-F"), bVar3)))))))) {
        IOcontroller::write_budget_order_seeds(psVar10,(TResult *)&res,psVar14,&graph);
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"---The End of ");
      poVar5 = std::operator<<(poVar5,(string *)psVar10);
      std::operator<<(poVar5,"---\n");
      Alg::~Alg(&tAlg);
      ResultInfo::~ResultInfo((ResultInfo *)&res);
    }
  }
LAB_0010fb71:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&budget_list.super__Vector_base<double,_std::allocator<double>_>);
  std::ofstream::~ofstream(&outputFile);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&vec_degree.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::~vector(&resgraph);
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::~vector(&graph);
  iVar30 = 0;
LAB_0010fbab:
  std::__cxx11::string::~string((string *)&infilename);
  Argument::~Argument(&Arg);
  return iVar30;
}

Assistant:

int main(int argc, char* argv[])
{
    // Randomize the seed for generating random numbers
    dsfmt_gv_init_gen_rand(static_cast<uint32_t>(time(nullptr)));
    const TArgument Arg(argc, argv);
    const string infilename = Arg._dir + "/" + Arg._graphname;
    if (Arg._func == 0 || Arg._func == 2) {
        // Format the graph
        GraphBase::format_graph(infilename, Arg._mode);
        if (Arg._func == 0) {
            return 1;
        }
    }

    cout << "---The Begin of " << Arg._outFileName << "---\n";
    Timer mainTimer("main");
    cout << "Format Graph Successfully" << endl;

    // Load the reverse graph
    Graph graph = GraphBase::load_graph(infilename, false, Arg._probDist, Arg._probEdge);
    Graph resgraph = GraphBase::load_graph(infilename, true, Arg._probDist, Arg._probEdge);
    cout << "Load Graph Successfully" << endl;

    vector<size_t> vec_degree(graph.size(), 0);
    std::ofstream outputFile("degree_" + Arg._graphname);
    size_t count_degree = 0;
    for (size_t i = 0; i < graph.size(); i++) {
        vec_degree[i] = graph[i].size();
        count_degree = count_degree + graph[i].size();
    }
    std::cout << "# Node: " << graph.size() << std::endl;
    std::cout << "# Edge: " << count_degree << std::endl;
    std::cout << "Ave degree: " << (double) count_degree / graph.size() << std::endl;
    outputFile.close();
    sort(vec_degree.begin(), vec_degree.end(), [](auto & left, auto & right){
        return left < right;
    });

    // Assign budget for each node
    vector<double> budget_list(graph.size(), 0);
    default_random_engine engine;
    uniform_int_distribution<unsigned> u(5, 10);
    for (size_t i = 0; i < graph.size(); i++) {
        if (graph[i].size() > vec_degree[int(Arg._percent * graph.size())]) {
            budget_list[i] = (double) 10 * 0.001 * graph[i].size();
//            budget_list[i] = (double) u(engine) * 0.001 * graph[i].size();
        }
        else {
            budget_list[i] = (double) 10 * Arg._normalpha * graph[i].size();
//            budget_list[i] = (double) u(engine) * Arg._normalpha * graph[i].size();
        }
    }
    double real_budget = (double) Arg._budpercent * int(Arg._percent * graph.size());
//    double real_budget = (double) Arg._budpercent * int(graph.size());
    std::cout << "0.3 percent degree: " << vec_degree[int(0.3 * graph.size())] << std::endl;
    std::cout << "0.5 percent degree: " << vec_degree[int(0.5 * graph.size())] << std::endl;
    std::cout << "0.7 percent degree: " << vec_degree[int(0.7 * graph.size())] << std::endl;
    std::cout << "0.9 percent degree: " << vec_degree[int(0.9 * graph.size())] << std::endl;
    std::cout << "0.95 percent degree: " << vec_degree[int(0.95 * graph.size())] << std::endl;
    std::cout << "0.99 percent degree: " << vec_degree[int(0.99 * graph.size())] << std::endl;
    std::cout << "0.999 percent degree: " << vec_degree[int(0.999 * graph.size())] << std::endl;
    std::cout << "0.9999 percent degree: " << vec_degree[int(0.9999 * graph.size())] << std::endl;
    std::cout << "0.99995 percent degree: " << vec_degree[int(0.99995 * graph.size())] << std::endl;
    std::cout << "0.99999 percent degree: " << vec_degree[int(0.99999 * graph.size())] << std::endl;
    std::cout << "0.999999 percent degree: " << vec_degree[int(0.999999 * graph.size())] << std::endl;
    std::cout << "0.9999999 percent degree: " << vec_degree[int(0.9999999 * graph.size())] << std::endl;
    std::cout << "0.99999999 percent degree: " << vec_degree[int(0.99999999 * graph.size())] << std::endl;
    std::cout << "# nodes: " << int(Arg._percent * graph.size()) << std::endl;
    std::cout << "real budget: " << real_budget << std::endl;

    if (Arg._algName == "CELF" || Arg._algName == "celf" ||
        Arg._algName == "CELF++" || Arg._algName == "celf++") {
        if (Arg._algName == "CELF" || Arg._algName == "celf") {
            cout << "start CELF algorithm" << endl;
            Timer EvalTimer;
            vector<size_t> res = CELF::celfalgo(graph, Arg._budget, budget_list, Arg._model);
            cout << "Time used (sec): " << EvalTimer.get_total_time() << endl;
            for(unsigned int re : res) {
                cout << re << " ";
            }
            cout << endl;
            cout << "Seed Size: " << res.size() << endl;
        }
        else if (Arg._algName == "CELF++" || Arg._algName == "celf++") {
            cout << "start CELF++ algorithm" << endl;
            Timer EvalTimer;
            vector<size_t> res = CELFPP::celfppalgo(graph, Arg._budget, budget_list, Arg._model);
            cout << "Time used (sec): " << EvalTimer.get_total_time() << endl;
            for(unsigned int re : res) {
                cout << re << " ";
            }
            cout << endl;
            cout << "Seed Size: " << res.size() << endl;
        }
    }
    // IMAGE == opim-b-fe IMAGE-BR = opim-b
    else if (Arg._algName == "opim-c" || Arg._algName == "OPIM-C" ||
             Arg._algName == "opim" || Arg._algName == "OPIM" ||
             Arg._algName == "opim-b" || Arg._algName == "OPIM-B" ||
             Arg._algName == "opim-b-n" || Arg._algName == "OPIM-B-N" ||
             Arg._algName == "opim-b-fe" || Arg._algName == "OPIM-B-FE" ||
             Arg._algName == "opim-ba" || Arg._algName == "OPIM-BA" ||
             Arg._algName == "opim-b-fa" || Arg._algName == "OPIM-B-FA" ||
             Arg._algName == "opim-a" || Arg._algName == "OPIM-A" ||
             Arg._algName == "opim-a-f" || Arg._algName == "OPIM-A-F") {
        if (Arg._model == LT) {
            // Normalize the propagation probabilities in accumulation format for
            // LT cascade model for quickly generating RR sets
            to_normal_accum_prob(resgraph);
        }
        // Initialize a result object to record the results
        TResult tRes;
        TAlg tAlg(resgraph, tRes);
        tAlg.set_cascade_model(Arg._model); // Set propagation model

        cout << "  ==>Graph loaded for RIS! total time used (sec): " << mainTimer.get_total_time() << '\n';
        int mode = 2; // Default is to use the minimum upper bound among all the rounds
        if (Arg._mode == "0" || Arg._mode == "vanilla") {
            mode = 0;
        }
        else if (Arg._mode == "1" || Arg._mode == "last") {
            mode = 1;
        }
        auto delta = Arg._delta;
        if (delta < 0) {
            delta = 1.0 / resgraph.size();
        }
        if (Arg._algName == "opim-c" || Arg._algName == "OPIM-C") {
            tAlg.opimc(Arg._seedsize, Arg._eps, delta, mode);
        }
        else if (Arg._algName == "opim" || Arg._algName == "OPIM") {
            tAlg.opim(Arg._seedsize, Arg._samplesize, delta, mode);
        }
        else if (Arg._algName == "opim-b" || Arg._algName == "OPIM-B") {
            cout << "OPIM-B" << endl;
            tAlg.opimb(graph, real_budget, budget_list, Arg._eps, delta, mode);
        }
        else if (Arg._algName == "opim-b-n" || Arg._algName == "OPIM-B-N") {
            cout << "OPIM-B-NAIVE" << endl;
            tAlg.opimb_naive(graph, real_budget, budget_list, Arg._eps, delta, 0);
        }
        else if (Arg._algName == "opim-b-fe" || Arg._algName == "OPIM-B-FE") {
            cout << "OPIM-B-FAST-END" << endl;
            if (Arg._model == LT && Arg._graphname == "twitter") {
                tAlg.opimb_fast_end(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "LT",
                        Arg._graphname, 1);
            }
            else {
                if (Arg._model == LT) {
                    tAlg.opimb_fast_end(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "LT",
                            Arg._graphname, mode);
                }
                else {
                    tAlg.opimb_fast_end(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "IC",
                            Arg._graphname, mode);
                }
            }
        }
        else if (Arg._algName == "opim-ba" || Arg._algName == "OPIM-BA") {
            cout << "OPIM-B-APPROX" << endl;
            tAlg.opimb_approx(graph, real_budget, budget_list, Arg._eps, delta, mode);
        }
        else if (Arg._algName == "opim-b-fa" || Arg._algName == "OPIM-B-FA") {
            cout << "OPIM-B-FAST-APPROX" << endl;
            tAlg.opimb_fast_approx(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, mode);
        }
        else if (Arg._algName == "opim-a" || Arg._algName == "OPIM-A") {
            cout << "OPIM-APPROX" << endl;
            if (Arg._model == LT) {
                tAlg.opim_approx(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "LT",
                                 Arg._graphname, mode);
            }
            else {
                tAlg.opim_approx(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "IC",
                                 Arg._graphname, mode);
            }

        }
        else if (Arg._algName == "opim-a-f" || Arg._algName == "OPIM-A-F") {
            cout << "OPIM-APPROX-FAST" << endl;
            if (Arg._model == LT) {
                tAlg.opim_approx_fast(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "LT",
                        Arg._graphname, mode);
            }
            else {
                tAlg.opim_approx_fast(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "IC",
                        Arg._graphname, mode);
            }
        }
        TIO::write_result(Arg._outFileName, tRes, Arg._resultFolder);
        TIO::write_order_seeds(Arg._outFileName, tRes, Arg._resultFolder, graph);
        if (Arg._algName == "opim-b" || Arg._algName == "OPIM-B" ||
            Arg._algName == "opim-b-n" || Arg._algName == "OPIM-B-N" ||
            Arg._algName == "opim-b-fe" || Arg._algName == "OPIM-B-FE" ||
            Arg._algName == "opim-ba" || Arg._algName == "OPIM-BA" ||
            Arg._algName == "opim-b-fa" || Arg._algName == "OPIM-B-FA" ||
            Arg._algName == "opim-a" || Arg._algName == "OPIM-A" ||
            Arg._algName == "opim-a-f" || Arg._algName == "OPIM-A-F") {
            TIO::write_budget_order_seeds(Arg._outFileName, tRes, Arg._resultFolder, graph);
        }
        cout << "---The End of " << Arg._outFileName << "---\n";
    }

    return 0;
}